

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O1

void bench_ecmult_0p_g(void *arg,int iters)

{
  ulong uVar1;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_strauss_state local_860;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  if (0 < iters) {
    uVar1 = 0;
    do {
      local_860.aux = local_848;
      local_860.pre_a = local_708;
      local_860.ps = &local_448;
      secp256k1_ecmult_strauss_wnaf
                (&local_860,(secp256k1_gej *)(uVar1 * 0x80 + *(long *)((long)arg + 0x60)),1,
                 (secp256k1_gej *)0x0,&secp256k1_scalar_zero,
                 (secp256k1_scalar *)
                 ((ulong)((*(int *)((long)arg + 0x50) + (int)uVar1 & 0x7fffU) << 5) +
                 *(long *)((long)arg + 0x10)));
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)iters);
  }
  return;
}

Assistant:

static void bench_ecmult_0p_g(void* arg, int iters) {
    bench_data* data = (bench_data*)arg;
    int i;

    for (i = 0; i < iters; ++i) {
        secp256k1_ecmult(&data->output[i], NULL, &secp256k1_scalar_zero, &data->scalars[(data->offset1+i) % POINTS]);
    }
}